

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_int,_5,_5,_15,_2U>
tcu::Float<unsigned_int,5,5,15,2u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = other->m_value;
  if (-1 < (int)uVar5) {
    if (uVar5 == 0x7f800000) {
      return (Float<unsigned_int,_5,_5,_15,_2U>)0x3e0;
    }
    uVar4 = uVar5 & 0x7f800000;
    uVar3 = uVar5 & 0x7fffff;
    if (uVar4 == 0x7f800000 && uVar3 != 0) {
      return (Float<unsigned_int,_5,_5,_15,_2U>)0x3ff;
    }
    if (uVar5 != 0) {
      uVar2 = uVar3 + 0x800000;
      if (uVar4 == 0 && uVar3 != 0) {
        uVar2 = uVar3;
      }
      uVar7 = (ulong)uVar2;
      if (uVar4 != 0 || uVar3 == 0) {
        uVar5 = (uVar5 >> 0x17) - 0x7f;
      }
      else {
        lVar1 = 0x3f;
        if ((uVar2 & 0x7fffff) != 0) {
          for (; (uVar2 & 0x7fffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar7 = uVar7 << (~(byte)lVar1 + 0x18 & 0x3f);
        uVar5 = ((uint)lVar1 ^ 0xffffffc0) - 0x55;
      }
      if ((int)uVar5 < -0xe) {
        if (uVar5 < 0xffffffec) {
          return (Float<unsigned_int,_5,_5,_15,_2U>)0;
        }
        return (Float<unsigned_int,_5,_5,_15,_2U>)
               (StorageType)
               (~(-1L << (3U - (char)uVar5 & 0x3f)) + uVar7 +
                (ulong)((uVar7 >> ((ulong)(4 - uVar5) & 0x3f) & 1) != 0) >>
               ((byte)(4 - uVar5) & 0x3f));
      }
      uVar7 = (uVar7 & 0xffffffffff7fffff) + 0x1ffff + (ulong)(((uint)uVar7 >> 0x12 & 1) != 0);
      iVar6 = uVar5 + (((uint)uVar7 & 0x800000) >> 0x17);
      if (0xf < iVar6) {
        return (Float<unsigned_int,_5,_5,_15,_2U>)0x3e0;
      }
      uVar5 = (uint)(uVar7 >> 0x12);
      if ((uVar7 & 0x800000) != 0) {
        uVar5 = 0;
      }
      return (Float<unsigned_int,_5,_5,_15,_2U>)(uVar5 | iVar6 * 0x20 + 0x1e0U);
    }
  }
  return (Float<unsigned_int,_5,_5,_15,_2U>)0;
}

Assistant:

inline int				signBit			(void) const	{ return (int)(m_value >> (ExponentBits+MantissaBits)) & 1;					}